

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typename.h
# Opt level: O2

string * type_name<int&>(void)

{
  char *pcVar1;
  char *pcVar2;
  string *in_RDI;
  unique_ptr<char,_void_(*)(void_*)> own;
  allocator local_21;
  unique_ptr<char,_void_(*)(void_*)> local_20;
  
  pcVar1 = _terminate;
  local_20._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>._M_head_impl
       = (char *)__cxa_demangle(_terminate + (*_terminate == '*'),0,0,0);
  local_20._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
  super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)free;
  pcVar2 = local_20._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
           super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
           _M_head_impl;
  if (local_20._M_t.super___uniq_ptr_impl<char,_void_(*)(void_*)>._M_t.
      super__Tuple_impl<0UL,_char_*,_void_(*)(void_*)>.super__Head_base<0UL,_char_*,_false>.
      _M_head_impl == (char *)0x0) {
    pcVar2 = pcVar1 + (*pcVar1 == '*');
  }
  std::__cxx11::string::string((string *)in_RDI,pcVar2,&local_21);
  std::__cxx11::string::append((char *)in_RDI);
  std::unique_ptr<char,_void_(*)(void_*)>::~unique_ptr(&local_20);
  return in_RDI;
}

Assistant:

std::string
type_name()
{
    typedef typename std::remove_reference<T>::type TR;
    std::unique_ptr<char, void(*)(void*)> own(
#ifndef _MSC_VER
        abi::__cxa_demangle(typeid(TR).name(), nullptr,
                            nullptr, nullptr),
#else
        nullptr,
#endif
        std::free);
    std::string r = own != nullptr ? own.get() : typeid(TR).name();
    if (std::is_const<TR>::value)
        r += " const";
    if (std::is_volatile<TR>::value)
        r += " volatile";
    if (std::is_lvalue_reference<T>::value)
        r += "&";
    else if (std::is_rvalue_reference<T>::value)
        r += "&&";
    return r;
}